

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_pubkey_tweak_add(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *tweak)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int overflow;
  secp256k1_ge p;
  secp256k1_scalar term;
  secp256k1_gej pt;
  secp256k1_fe zr [8];
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge pre_a [8];
  secp256k1_gej prej [8];
  int local_d74;
  secp256k1_ge local_d70;
  secp256k1_scalar local_d18;
  secp256k1_scalar local_cf8;
  secp256k1_strauss_state local_cd8;
  secp256k1_gej local_cb8;
  secp256k1_fe local_c38 [8];
  secp256k1_strauss_point_state local_af8;
  secp256k1_ge local_6e8 [8];
  secp256k1_gej local_428 [8];
  
  local_d74 = 0;
  if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    secp256k1_ec_pubkey_tweak_add_cold_1();
    uVar2 = 0;
  }
  else {
    secp256k1_scalar_set_b32(&local_d18,tweak,&local_d74);
    if (local_d74 == 0) {
      iVar1 = secp256k1_pubkey_load(ctx,&local_d70,pubkey);
      bVar3 = iVar1 != 0;
    }
    else {
      bVar3 = false;
    }
    pubkey->data[0x30] = '\0';
    pubkey->data[0x31] = '\0';
    pubkey->data[0x32] = '\0';
    pubkey->data[0x33] = '\0';
    pubkey->data[0x34] = '\0';
    pubkey->data[0x35] = '\0';
    pubkey->data[0x36] = '\0';
    pubkey->data[0x37] = '\0';
    pubkey->data[0x38] = '\0';
    pubkey->data[0x39] = '\0';
    pubkey->data[0x3a] = '\0';
    pubkey->data[0x3b] = '\0';
    pubkey->data[0x3c] = '\0';
    pubkey->data[0x3d] = '\0';
    pubkey->data[0x3e] = '\0';
    pubkey->data[0x3f] = '\0';
    pubkey->data[0x20] = '\0';
    pubkey->data[0x21] = '\0';
    pubkey->data[0x22] = '\0';
    pubkey->data[0x23] = '\0';
    pubkey->data[0x24] = '\0';
    pubkey->data[0x25] = '\0';
    pubkey->data[0x26] = '\0';
    pubkey->data[0x27] = '\0';
    pubkey->data[0x28] = '\0';
    pubkey->data[0x29] = '\0';
    pubkey->data[0x2a] = '\0';
    pubkey->data[0x2b] = '\0';
    pubkey->data[0x2c] = '\0';
    pubkey->data[0x2d] = '\0';
    pubkey->data[0x2e] = '\0';
    pubkey->data[0x2f] = '\0';
    pubkey->data[0x10] = '\0';
    pubkey->data[0x11] = '\0';
    pubkey->data[0x12] = '\0';
    pubkey->data[0x13] = '\0';
    pubkey->data[0x14] = '\0';
    pubkey->data[0x15] = '\0';
    pubkey->data[0x16] = '\0';
    pubkey->data[0x17] = '\0';
    pubkey->data[0x18] = '\0';
    pubkey->data[0x19] = '\0';
    pubkey->data[0x1a] = '\0';
    pubkey->data[0x1b] = '\0';
    pubkey->data[0x1c] = '\0';
    pubkey->data[0x1d] = '\0';
    pubkey->data[0x1e] = '\0';
    pubkey->data[0x1f] = '\0';
    pubkey->data[0] = '\0';
    pubkey->data[1] = '\0';
    pubkey->data[2] = '\0';
    pubkey->data[3] = '\0';
    pubkey->data[4] = '\0';
    pubkey->data[5] = '\0';
    pubkey->data[6] = '\0';
    pubkey->data[7] = '\0';
    pubkey->data[8] = '\0';
    pubkey->data[9] = '\0';
    pubkey->data[10] = '\0';
    pubkey->data[0xb] = '\0';
    pubkey->data[0xc] = '\0';
    pubkey->data[0xd] = '\0';
    pubkey->data[0xe] = '\0';
    pubkey->data[0xf] = '\0';
    if (bVar3 != false) {
      local_cb8.infinity = local_d70.infinity;
      local_cb8.x.n[0] = local_d70.x.n[0];
      local_cb8.x.n[1] = local_d70.x.n[1];
      local_cb8.x.n[2] = local_d70.x.n[2];
      local_cb8.x.n[3] = local_d70.x.n[3];
      local_cb8.x.n[4] = local_d70.x.n[4];
      local_cb8.y.n[0] = local_d70.y.n[0];
      local_cb8.y.n[1] = local_d70.y.n[1];
      local_cb8.y.n[2] = local_d70.y.n[2];
      local_cb8.y.n[3] = local_d70.y.n[3];
      local_cb8.y.n[4] = local_d70.y.n[4];
      local_cb8.z.n[0] = 1;
      local_cb8.z.n[1] = 0;
      local_cb8.z.n[2] = 0;
      local_cb8.z.n[3] = 0;
      local_cb8.z.n[4] = 0;
      local_cf8.d[0] = 1;
      local_cf8.d[1] = 0;
      local_cf8.d[2] = 0;
      local_cf8.d[3] = 0;
      local_cd8.prej = local_428;
      local_cd8.zr = local_c38;
      local_cd8.pre_a = local_6e8;
      local_cd8.ps = &local_af8;
      secp256k1_ecmult_strauss_wnaf
                (&ctx->ecmult_ctx,&local_cd8,&local_cb8,1,&local_cb8,&local_cf8,&local_d18);
      if (local_cb8.infinity == 0) {
        secp256k1_ge_set_gej(&local_d70,&local_cb8);
        secp256k1_ge_to_storage((secp256k1_ge_storage *)&local_af8,&local_d70);
        *(undefined8 *)(pubkey->data + 0x30) = local_af8.wnaf_na._48_8_;
        *(undefined8 *)(pubkey->data + 0x38) = local_af8.wnaf_na._56_8_;
        *(undefined8 *)(pubkey->data + 0x20) = local_af8.wnaf_na._32_8_;
        *(undefined8 *)(pubkey->data + 0x28) = local_af8.wnaf_na._40_8_;
        *(undefined8 *)(pubkey->data + 0x10) = local_af8.wnaf_na._16_8_;
        *(undefined8 *)(pubkey->data + 0x18) = local_af8.wnaf_na._24_8_;
        *(undefined8 *)pubkey->data = local_af8.wnaf_na._0_8_;
        *(undefined8 *)(pubkey->data + 8) = local_af8.wnaf_na._8_8_;
      }
      else {
        bVar3 = false;
      }
    }
    uVar2 = (uint)bVar3;
  }
  return uVar2;
}

Assistant:

int secp256k1_ec_pubkey_tweak_add(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *tweak) {
    secp256k1_ge p;
    secp256k1_scalar term;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(tweak != NULL);

    secp256k1_scalar_set_b32(&term, tweak, &overflow);
    ret = !overflow && secp256k1_pubkey_load(ctx, &p, pubkey);
    memset(pubkey, 0, sizeof(*pubkey));
    if (ret) {
        if (secp256k1_eckey_pubkey_tweak_add(&ctx->ecmult_ctx, &p, &term)) {
            secp256k1_pubkey_save(pubkey, &p);
        } else {
            ret = 0;
        }
    }

    return ret;
}